

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O2

void __thiscall Operator::update_AM1_VIB1_EGT1_KSR1_MULT4(Operator *this,OPL3 *OPL3)

{
  EnvelopeGenerator *this_00;
  byte bVar1;
  
  bVar1 = OPL3->registers[(long)this->operatorBaseAddress + 0x20];
  this->am = (uint)(bVar1 >> 7);
  this->vib = bVar1 >> 6 & 1;
  this->egt = bVar1 >> 5 & 1;
  this->ksr = bVar1 >> 4 & 1;
  this->mult = bVar1 & 0xf;
  PhaseGenerator::setFrequency(&this->phaseGenerator,this->f_number,this->block,bVar1 & 0xf);
  this_00 = &this->envelopeGenerator;
  EnvelopeGenerator::setActualAttackRate(this_00,this->ar,this->ksr,this->keyScaleNumber);
  EnvelopeGenerator::setActualDecayRate(this_00,this->dr,this->ksr,this->keyScaleNumber);
  EnvelopeGenerator::setActualReleaseRate(this_00,this->rr,this->ksr,this->keyScaleNumber);
  return;
}

Assistant:

void Operator::update_AM1_VIB1_EGT1_KSR1_MULT4(OPL3 *OPL3) {
	
	int am1_vib1_egt1_ksr1_mult4 = OPL3->registers[operatorBaseAddress+OperatorDataStruct::AM1_VIB1_EGT1_KSR1_MULT4_Offset];
	
	// Amplitude Modulation. This register is used int EnvelopeGenerator.getEnvelope();
	am  = (am1_vib1_egt1_ksr1_mult4 & 0x80) >> 7;
	// Vibrato. This register is used in PhaseGenerator.getPhase();
	vib = (am1_vib1_egt1_ksr1_mult4 & 0x40) >> 6;
	// Envelope Generator Type. This register is used in EnvelopeGenerator.getEnvelope();
	egt = (am1_vib1_egt1_ksr1_mult4 & 0x20) >> 5;
	// Key Scale Rate. Sets the actual envelope rate together with rate and keyScaleNumber.
	// This register os used in EnvelopeGenerator.setActualAttackRate().
	ksr = (am1_vib1_egt1_ksr1_mult4 & 0x10) >> 4;
	// Multiple. Multiplies the Channel.baseFrequency to get the Operator.operatorFrequency.
	// This register is used in PhaseGenerator.setFrequency().
	mult = am1_vib1_egt1_ksr1_mult4 & 0x0F;
	
	phaseGenerator.setFrequency(f_number, block, mult);
	envelopeGenerator.setActualAttackRate(ar, ksr, keyScaleNumber);
	envelopeGenerator.setActualDecayRate(dr, ksr, keyScaleNumber); 
	envelopeGenerator.setActualReleaseRate(rr, ksr, keyScaleNumber);
}